

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int64_t av1_block_error_lp_c(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  long lVar1;
  long lVar2;
  
  if (0 < block_size) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      lVar1 = lVar1 + (ulong)(uint)(((int)coeff[lVar2] - (int)dqcoeff[lVar2]) *
                                   ((int)coeff[lVar2] - (int)dqcoeff[lVar2]));
      lVar2 = lVar2 + 1;
    } while (block_size != lVar2);
    return lVar1;
  }
  return 0;
}

Assistant:

int64_t av1_block_error_lp_c(const int16_t *coeff, const int16_t *dqcoeff,
                             intptr_t block_size) {
  int64_t error = 0;

  for (int i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
  }

  return error;
}